

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int entity5(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"NDATA");
    if (iVar1 != 0) {
      iVar1 = 0;
      pcVar2 = entity6;
      goto LAB_004e3fcd;
    }
  }
  else {
    if (tok == 0x11) {
      pcVar2 = internalSubset;
      if (state->documentEntity == 0) {
        pcVar2 = externalSubset1;
      }
      iVar1 = 0xd;
      goto LAB_004e3fcd;
    }
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  iVar1 = -1;
  pcVar2 = error;
LAB_004e3fcd:
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static
int entity5(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_ENTITY_COMPLETE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NDATA)) {
      state->handler = entity6;
      return XML_ROLE_NONE;
    }
    break;
  }
  return common(state, tok);
}